

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall Client::handleGetUserPostsRequest(Client *this,GetUserPostsRequest *request)

{
  value_t vVar1;
  pointer pcVar2;
  CommunicationStack *pCVar3;
  pointer pbVar4;
  json_value jVar5;
  json_value jVar6;
  bool bVar7;
  reference pvVar8;
  json_value jVar9;
  Event EVar10;
  vector<Post,_std::allocator<Post>_> posts;
  json j_array;
  json j_post;
  Post post;
  User temp;
  undefined1 local_258 [8];
  json_value local_250;
  undefined1 local_248 [8];
  json_value local_240;
  json_value local_238;
  json_value jStack_230;
  pointer local_228;
  Client *local_218;
  undefined1 local_210 [8];
  json_value local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [8];
  json_value jStack_1c8;
  pointer local_1c0;
  undefined1 local_198 [16];
  json_value local_188;
  undefined1 auStack_180 [8];
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  char *local_160;
  char local_150 [16];
  char *local_140;
  char local_130 [16];
  char *local_120;
  char local_110 [24];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  json_value local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (this->user == (User *)0x0) {
    bVar7 = true;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (request->username)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (request->username)._M_string_length);
    bVar7 = Database::containsForbiddenChars(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (bVar7 == false) {
    local_238.object = (object_t *)0x0;
    jStack_230 = (json_value)0x0;
    local_228 = (pointer)0x0;
    local_f0 = (undefined1  [8])local_e0;
    local_e8.object = (object_t *)0x0;
    local_e0[0] = 0;
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    local_f8._0_4_ = 0;
    pcVar2 = (request->username)._M_dataplus._M_p;
    local_218 = this;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (request->username)._M_string_length);
    Database::getUserByUsername((User *)&local_188,&server.database,&local_70);
    local_f8._0_4_ = local_188.number_integer._0_4_;
    std::__cxx11::string::_M_assign((string *)local_f0);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    std::__cxx11::string::_M_assign((string *)&local_b0);
    std::__cxx11::string::_M_assign((string *)&local_90);
    if (local_120 != local_110) {
      operator_delete(local_120);
    }
    if (local_140 != local_130) {
      operator_delete(local_140);
    }
    if (local_160 != local_150) {
      operator_delete(local_160);
    }
    if (auStack_180 !=
        (undefined1  [8])
        &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_180)->field_2
       ) {
      operator_delete((void *)auStack_180);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    Database::getPostsByUserId
              ((vector<Post,_std::allocator<Post>_> *)local_1d0,&server.database,local_f8._0_4_);
    local_178 = (size_type)local_228;
    auStack_180 = (undefined1  [8])jStack_230;
    local_188 = local_238;
    local_238 = (json_value)local_1d0;
    jStack_230 = jStack_1c8;
    local_228 = local_1c0;
    local_1d0 = (undefined1  [8])0x0;
    jStack_1c8.object = (object_t *)0x0;
    local_1c0 = (pointer)0x0;
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)&local_188);
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)local_1d0);
    local_1d0 = (undefined1  [8])((ulong)local_1d0 & 0xffffffffffffff00);
    jStack_1c8.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1d0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1d0);
    local_210[0] = null;
    local_208.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_210);
    jVar6 = jStack_230;
    if (local_238.object != jStack_230.object) {
      jVar9 = local_238;
      do {
        local_188 = *(json_value *)&((jVar9.object)->_M_t)._M_impl;
        auStack_180 = (undefined1  [8])
                      &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_180)->field_2;
        pbVar4 = ((jVar9.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_180,pbVar4,
                   &(((jVar9.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + (long)pbVar4);
        local_250 = (json_value)(long)(int)local_188.number_integer._0_4_;
        local_258[0] = number_integer;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_258);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_258);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_1d0,"id");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_258);
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_258[0];
        jVar5 = pvVar8->m_value;
        pvVar8->m_value = local_250;
        local_258[0] = vVar1;
        local_250 = jVar5;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pvVar8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_258);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy
                  ((json_value *)
                   &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_258)->m_value,local_258[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_180)
        ;
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_1d0,"content");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_248);
        vVar1 = pvVar8->m_type;
        pvVar8->m_type = local_248[0];
        jVar5 = pvVar8->m_value;
        pvVar8->m_value = local_240;
        local_248[0] = vVar1;
        local_240 = jVar5;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pvVar8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_248);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy
                  ((json_value *)
                   &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_248)->m_value,local_248[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_210,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1d0);
        if (auStack_180 !=
            (undefined1  [8])
            &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_180)->
             field_2) {
          operator_delete((void *)auStack_180);
        }
        jVar9.object = (object_t *)
                       &((jVar9.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      } while (jVar9.object != jVar6.object);
    }
    pCVar3 = local_218->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_200,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_210);
    GetUserPostsResponse::GetUserPostsResponse
              ((GetUserPostsResponse *)&local_188,true,(json *)local_200);
    EVar10 = GetUserPostsResponse::operator_cast_to_basic_json((GetUserPostsResponse *)local_1f0);
    (*(pCVar3->super_IONotifiable)._vptr_IONotifiable[3])(pCVar3,local_1f0,EVar10.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_1f0 + 8),local_1f0[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)auStack_180);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_180)->
                _M_string_length,auStack_180[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_200);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_200 + 8),local_200[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_210)->m_value,local_210[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1d0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &(((vector<Post,_std::allocator<Post>_> *)local_1d0)->
                super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.super__Vector_impl_data.
                _M_finish,local_1d0[0]);
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0);
    }
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)&local_238);
  }
  else {
    pCVar3 = this->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[1],_char[1],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_198,(char (*) [1])0x1a6662);
    GetUserPostsResponse::GetUserPostsResponse
              ((GetUserPostsResponse *)local_f8,false,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_198);
    EVar10 = GetUserPostsResponse::operator_cast_to_basic_json((GetUserPostsResponse *)local_1e0);
    (*(pCVar3->super_IONotifiable)._vptr_IONotifiable[3])(pCVar3,local_1e0,EVar10.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_1e0 + 8),local_1e0[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy
              ((json_value *)
               &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_f0)->m_value,local_f0[0]);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_198);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_198 + 8),local_198[0]);
  }
  return;
}

Assistant:

void Client::handleGetUserPostsRequest(GetUserPostsRequest request)
{
	if(user == nullptr || Database::containsForbiddenChars(request.username))
	{
		communicationStack->sendEvent(GetUserPostsResponse(false,""));
		return;
	}

	std::vector<Post> posts;
	User temp;

	try
	{
		temp = server.database.getUserByUsername(request.username);
		posts = server.database.getPostsByUserId(temp.getId());
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(GetUserPostsResponse(false, ""));
		return;
	}

	json j_post;
	json j_array;

	for(auto post: posts)
	{
		j_post["id"] = post.getId();
		j_post["content"] = post.getContent();
		j_array.push_back(j_post);
	}

	communicationStack->sendEvent(GetUserPostsResponse(true, j_array));
}